

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

Value * __thiscall toml::Value::setChild(Value *this,string *key,Value *v)

{
  pointer *ppVVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  *p_Var3;
  mapped_type *pmVar4;
  Value local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  local_58;
  
  if (this->type_ == NULL_TYPE) {
    p_Var2 = &local_58._M_impl.super__Rb_tree_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl._0_8_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68.type_ = TABLE_TYPE;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    local_68.field_1.null_ = operator_new(0x30);
    ppVVar1 = (pointer *)&(local_68.field_1.string_)->_M_string_length;
    *(undefined4 *)&(local_68.field_1.string_)->_M_string_length = 0;
    if (local_58._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      ((local_68.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(pointer **)((long)&(local_68.field_1.string_)->field_2 + 8) = ppVVar1;
      ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)ppVVar1;
      p_Var3 = &((local_68.field_1.table_)->_M_t)._M_impl;
    }
    else {
      ((local_68.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = &local_58._M_impl;
      *(_Base_ptr *)((long)&(local_68.field_1.string_)->field_2 + 8) =
           local_58._M_impl.super__Rb_tree_header._M_header._M_left;
      ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           local_58._M_impl.super__Rb_tree_header._M_header._M_right;
      ((anon_union_8_8_51f126cb_for_Value_2 *)
      &(local_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->null_ = ppVVar1;
      ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
           local_58._M_impl.super__Rb_tree_header._M_node_count;
      local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    (p_Var3->super__Rb_tree_header)._M_node_count = 0;
    if (&local_68 != this) {
      ~Value(this);
      this->type_ = local_68.type_;
      switch(local_68.type_) {
      case NULL_TYPE:
      case INT_TYPE:
      case STRING_TYPE:
      case TIME_TYPE:
      case ARRAY_TYPE:
      case TABLE_TYPE:
        (this->field_1).array_ = (Array *)local_68.field_1;
        break;
      case BOOL_TYPE:
        (this->field_1).bool_ = local_68.field_1.bool_;
        break;
      case DOUBLE_TYPE:
        (this->field_1).array_ = (Array *)local_68.field_1;
        break;
      default:
        this->type_ = NULL_TYPE;
        (this->field_1).null_ = (void *)0x0;
      }
      local_68.type_ = NULL_TYPE;
      local_68.field_1.null_ = (Array *)0x0;
    }
    ~Value(&local_68);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::~_Rb_tree(&local_58);
  }
  if (this->type_ != TABLE_TYPE) {
    failwith<char_const(&)[38]>((char (*) [38])"type must be table to do set(key, v).");
  }
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                         *)(this->field_1).string_,key);
  if (pmVar4 != v) {
    ~Value(pmVar4);
    pmVar4->type_ = v->type_;
    switch(v->type_) {
    case NULL_TYPE:
    case INT_TYPE:
    case STRING_TYPE:
    case TIME_TYPE:
    case ARRAY_TYPE:
    case TABLE_TYPE:
      pmVar4->field_1 = v->field_1;
      break;
    case BOOL_TYPE:
      (pmVar4->field_1).bool_ = (v->field_1).bool_;
      break;
    case DOUBLE_TYPE:
      pmVar4->field_1 = v->field_1;
      break;
    default:
      pmVar4->type_ = NULL_TYPE;
      (pmVar4->field_1).null_ = (void *)0x0;
    }
    v->type_ = NULL_TYPE;
    (v->field_1).null_ = (void *)0x0;
  }
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                         *)(this->field_1).string_,key);
  return pmVar4;
}

Assistant:

inline Value* Value::setChild(const std::string& key, Value&& v)
{
    if (!valid())
        *this = Value((Table()));

    if (!is<Table>())
        failwith("type must be table to do set(key, v).");

    (*table_)[key] = std::move(v);
    return &(*table_)[key];
}